

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

Address * ot::commissioner::Address::FromString(Address *__return_storage_ptr__,string *aAddr)

{
  Error local_40;
  
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Set(&local_40,__return_storage_ptr__,aAddr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.mMessage._M_dataplus._M_p != &local_40.mMessage.field_2) {
    operator_delete(local_40.mMessage._M_dataplus._M_p);
  }
  if (local_40.mCode == kNone) {
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Address Address::FromString(const std::string &aAddr)
{
    Address ret;

    SuccessOrDie(ret.Set(aAddr));
    return ret;
}